

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

bool sq_aux_gettypedarg(HSQUIRRELVM v,SQInteger idx,SQObjectType type,SQObjectPtr **o)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectPtr *o_00;
  SQObjectValue SVar3;
  SQChar *pSVar4;
  SQObjectPtr oval;
  SQObjectPtr local_30;
  
  o_00 = stack_get(v,idx);
  *o = o_00;
  SVar2 = (o_00->super_SQObject)._type;
  if (SVar2 != type) {
    SVar3.pString = SQVM::PrintObjVal(v,o_00);
    local_30.super_SQObject._type = OT_STRING;
    pSVar1 = &((SVar3.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    local_30.super_SQObject._unVal.pString = SVar3.pString;
    pSVar4 = IdType2Name(type);
    SQVM::Raise_Error(v,"wrong argument type, expected \'%s\' got \'%.50s\'",pSVar4,
                      &(SVar3.pTable)->_firstfree);
    SQObjectPtr::~SQObjectPtr(&local_30);
  }
  return SVar2 == type;
}

Assistant:

static bool sq_aux_gettypedarg(HSQUIRRELVM v,SQInteger idx,SQObjectType type,SQObjectPtr **o)
{
    *o = &stack_get(v,idx);
    if(sq_type(**o) != type){
        SQObjectPtr oval = v->PrintObjVal(**o);
        v->Raise_Error(_SC("wrong argument type, expected '%s' got '%.50s'"),IdType2Name(type),_stringval(oval));
        return false;
    }
    return true;
}